

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawInstancedTests.cpp
# Opt level: O0

void __thiscall vkt::Draw::InstancedTests::InstancedTests(InstancedTests *this,TestContext *testCtx)

{
  TestContext *testCtx_00;
  TestParams params;
  InstancedDrawCase *this_00;
  allocator<char> local_99;
  string local_98;
  string local_78;
  undefined1 local_48 [8];
  string testName;
  TestParams param;
  int functionNdx;
  int topologyNdx;
  TestContext *testCtx_local;
  InstancedTests *this_local;
  
  tcu::TestCaseGroup::TestCaseGroup
            (&this->super_TestCaseGroup,testCtx,"instanced","Instanced drawing tests");
  (this->super_TestCaseGroup).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InstancedTests_0166a5d8;
  for (param.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST; (int)param.topology < 6;
      param.topology = param.topology + VK_PRIMITIVE_TOPOLOGY_LINE_LIST) {
    for (param.function = FUNCTION_DRAW; (int)param.function < 4;
        param.function = param.function + FUNCTION_DRAW_INDEXED) {
      testName.field_2._8_4_ = InstancedTests::functions[(int)param.function];
      testName.field_2._12_4_ = InstancedTests::topologies[(int)param.topology];
      de::toString<vkt::Draw::(anonymous_namespace)::TestParams>
                ((string *)local_48,(TestParams *)((long)&testName.field_2 + 8));
      this_00 = (InstancedDrawCase *)operator_new(0xb8);
      testCtx_00 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
      de::toLower(&local_78,(string *)local_48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Instanced drawing test",&local_99);
      params.topology = testName.field_2._12_4_;
      params.function = testName.field_2._8_4_;
      Draw::anon_unknown_1::InstancedDrawCase::InstancedDrawCase
                (this_00,testCtx_00,&local_78,&local_98,params);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)local_48);
    }
  }
  return;
}

Assistant:

InstancedTests::InstancedTests(tcu::TestContext& testCtx)
	: TestCaseGroup	(testCtx, "instanced", "Instanced drawing tests")
{
	static const vk::VkPrimitiveTopology	topologies[]			=
	{
		vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST,
		vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST,
		vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,
		vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,
		vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,
		vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,
	};
	static const TestParams::DrawFunction	functions[]				=
	{
		TestParams::FUNCTION_DRAW,
		TestParams::FUNCTION_DRAW_INDEXED,
		TestParams::FUNCTION_DRAW_INDIRECT,
		TestParams::FUNCTION_DRAW_INDEXED_INDIRECT,
	};

	for (int topologyNdx = 0; topologyNdx < DE_LENGTH_OF_ARRAY(topologies); topologyNdx++)
	{
		for (int functionNdx = 0; functionNdx < DE_LENGTH_OF_ARRAY(functions); functionNdx++)
		{
			TestParams param;
			param.function = functions[functionNdx];
			param.topology = topologies[topologyNdx];

			std::string testName = de::toString(param);

			addChild(new InstancedDrawCase(m_testCtx, de::toLower(testName), "Instanced drawing test", param));
		}
	}
}